

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.cpp
# Opt level: O0

void __thiscall Mempool::retrieve(Mempool *this,Chunk *block)

{
  bool bVar1;
  mapped_type *ppCVar2;
  _Node_iterator_base<std::pair<const_int,_Chunk_*>,_false> local_48 [3];
  _Node_iterator_base<std::pair<const_int,_Chunk_*>,_false> local_30;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lck;
  int index;
  Chunk *block_local;
  Mempool *this_local;
  
  lck._M_device._4_4_ = block->capacity;
  block->length = 0;
  block->head = 0;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->mp_mutex);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_Chunk_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Chunk_*>_>_>
       ::find(&this->mp_pool,(key_type *)((long)&lck._M_device + 4));
  local_48[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_Chunk_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Chunk_*>_>_>
       ::end(&this->mp_pool);
  bVar1 = std::__detail::operator==(&local_30,local_48);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("mp_pool.find(index) != mp_pool.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/mem_pool.cpp"
                  ,0x57,"void Mempool::retrieve(Chunk *)");
  }
  ppCVar2 = std::
            unordered_map<int,_Chunk_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Chunk_*>_>_>
            ::operator[](&this->mp_pool,(key_type *)((long)&lck._M_device + 4));
  block->next = *ppCVar2;
  ppCVar2 = std::
            unordered_map<int,_Chunk_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Chunk_*>_>_>
            ::operator[](&this->mp_pool,(key_type *)((long)&lck._M_device + 4));
  *ppCVar2 = block;
  this->mp_left_size_kb = (long)(block->capacity / 0x400) + this->mp_left_size_kb;
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void Mempool::retrieve(Chunk *block)
{
    int index = block->capacity;
    block->length = 0;
    block->head = 0;

    lock_guard<mutex> lck(mp_mutex);
    assert(mp_pool.find(index) != mp_pool.end());

    block->next = mp_pool[index];
    mp_pool[index] = block;
    mp_left_size_kb += block->capacity/1024;
}